

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.cpp
# Opt level: O1

int __thiscall ncnn::Flatten::forward(Flatten *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  size_t _elemsize;
  int iVar2;
  long lVar3;
  ulong uVar4;
  size_t __n;
  
  lVar3 = (long)bottom_blob->d * (long)bottom_blob->h * (long)bottom_blob->w;
  uVar1 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  Mat::create(top_blob,(int)lVar3 * uVar1,_elemsize,opt->blob_allocator);
  iVar2 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < (int)uVar1) {
      __n = _elemsize * lVar3;
      lVar3 = 0;
      uVar4 = 0;
      do {
        memcpy((void *)((long)top_blob->data + lVar3),
               (void *)(bottom_blob->cstep * uVar4 * bottom_blob->elemsize + (long)bottom_blob->data
                       ),__n);
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + __n;
      } while (uVar1 != uVar4);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int Flatten::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h * d;

    top_blob.create(size * channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const unsigned char* ptr = bottom_blob.channel(q);
        unsigned char* outptr = (unsigned char*)top_blob + size * elemsize * q;

        memcpy(outptr, ptr, size * elemsize);
    }

    return 0;
}